

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,Allocator *_allocator)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Mat *pMVar1;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  Mat *in_stack_ffffffffffffffc0;
  int local_38;
  
  if (in_RSI->w * in_RSI->h * in_RSI->c == in_EDX * in_ECX) {
    pMVar1 = in_RDI;
    if ((in_RSI->dims == 3) && (in_RSI->cstep != (long)in_RSI->w * (long)in_RSI->h)) {
      Mat(in_RDI);
      create(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             (int)in_stack_ffffffffffffffb8,
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (int)((ulong)in_RSI >> 0x20),(Allocator *)pMVar1);
      for (local_38 = 0; local_38 < in_RSI->c; local_38 = local_38 + 1) {
        memcpy((void *)((long)in_RDI->data +
                       (long)(local_38 * in_RSI->w * in_RSI->h) * in_RSI->elemsize),
               (void *)((long)in_RSI->data + (long)local_38 * in_RSI->cstep * in_RSI->elemsize),
               (long)(in_RSI->w * in_RSI->h) * in_RSI->elemsize);
      }
    }
    else {
      Mat(in_RDI,in_RSI);
      in_RDI->dims = 2;
      in_RDI->w = in_EDX;
      in_RDI->h = in_ECX;
      in_RDI->c = 1;
      in_RDI->cstep = (long)(in_EDX * in_ECX);
    }
  }
  else {
    Mat(in_RDI);
    pMVar1 = in_RDI;
  }
  return pMVar1;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, Allocator* _allocator) const
{
    if (w * h * c != _w * _h)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, _h, elemsize, elempack, _allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.c = 1;

    m.cstep = _w * _h;

    return m;
}